

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

uint pugi::impl::anon_unknown_0::string_to_integer<unsigned_int>(char_t *value,uint minv,uint maxv)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  char_t *s;
  byte *pbVar5;
  ulong uVar6;
  char_t *pcVar7;
  byte bVar8;
  char_t *pcVar9;
  uint uVar10;
  bool bVar11;
  
  lVar4 = 0;
  do {
    lVar3 = lVar4;
    bVar1 = value[lVar3];
    lVar4 = lVar3 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
  uVar6 = (ulong)((bVar1 - 0x2b & 0xfd) == 0);
  if ((value[lVar3 + uVar6] == '0') && ((value[lVar4 + uVar6] & 0xdf) == 0x58)) {
    pbVar5 = value + lVar3 + 2 + uVar6;
    do {
      bVar8 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar8 == 0x30);
    uVar6 = 0;
    uVar2 = 0;
    do {
      if (bVar8 - 0x30 < 10) {
        uVar2 = uVar2 << 4 | bVar8 - 0x30;
      }
      else {
        if (5 < (bVar8 | 0x20) - 0x61) goto LAB_0011033f;
        uVar2 = uVar2 * 0x10 + -0x57 + (bVar8 | 0x20);
      }
      bVar8 = *pbVar5;
      uVar6 = uVar6 + 1;
      pbVar5 = pbVar5 + 1;
    } while( true );
  }
  pcVar7 = (char_t *)(uVar6 + lVar4);
  do {
    pcVar9 = pcVar7;
    bVar8 = value[(long)(pcVar9 + -1)];
    pcVar7 = pcVar9 + 1;
  } while (bVar8 == 0x30);
  pcVar9 = value + (long)(pcVar9 + -1);
  uVar10 = bVar8 - 0x30;
  uVar2 = 0;
  if (uVar10 < 10) {
    uVar2 = 0;
    do {
      uVar2 = uVar10 + uVar2 * 10;
      pbVar5 = pcVar9 + 1;
      pcVar9 = pcVar9 + 1;
      uVar10 = *pbVar5 - 0x30;
    } while (uVar10 < 10);
  }
  if ((char_t *)0x9 < pcVar9 + (-(long)pcVar7 - (long)value) + 2) {
    bVar11 = true;
    if (pcVar9 + (-8 - (long)value) != pcVar7) goto LAB_0011035a;
    if (0x33 < bVar8) {
      bVar11 = -1 < (int)uVar2 || bVar8 != 0x34;
      goto LAB_0011035a;
    }
  }
  bVar11 = false;
LAB_0011035a:
  if (bVar1 == 0x2d) {
    uVar10 = -uVar2;
    if (-minv < uVar2) {
      uVar10 = minv;
    }
    if (bVar11) {
      uVar10 = minv;
    }
    return uVar10;
  }
  if (maxv <= uVar2) {
    uVar2 = maxv;
  }
  if (bVar11) {
    uVar2 = maxv;
  }
  return uVar2;
LAB_0011033f:
  bVar11 = 8 < uVar6;
  goto LAB_0011035a;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}